

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O3

void __thiscall Entity::damage(Entity *this,int points)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar1 = this->health - points;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  this->health = iVar3;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," damaged to ",0xc);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->health);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"health",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Entity::damage(int points)
{
  health = std::max(0, health - points);
  std::cout << name << " damaged to " << health << "health" << std::endl;
}